

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O3

bool anon_unknown.dwarf_1c81ae::getStreamContents
               (InputStream *stream,vector<char,_std::allocator<char>_> *buffer)

{
  pointer *ppcVar1;
  iterator __position;
  ulong in_RAX;
  size_type __new_size;
  size_type sVar2;
  bool bVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  __new_size = (**(code **)(*(long *)stream + 0x28))();
  if ((long)__new_size < 1) {
    bVar3 = true;
  }
  else {
    std::vector<char,_std::allocator<char>_>::resize(buffer,__new_size);
    (**(code **)(*(long *)stream + 0x18))(stream,0);
    sVar2 = (**(code **)(*(long *)stream + 0x10))
                      (stream,(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start,__new_size);
    bVar3 = sVar2 == __new_size;
  }
  uStack_28 = uStack_28 & 0xffffffffffffff;
  __position._M_current =
       (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (buffer,__position,(char *)((long)&uStack_28 + 7));
  }
  else {
    *__position._M_current = '\0';
    ppcVar1 = &(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return bVar3;
}

Assistant:

bool getStreamContents(sf::InputStream& stream, std::vector<char>& buffer)
    {
        bool success = true;
        sf::Int64 size = stream.getSize();
        if (size > 0)
        {
            buffer.resize(static_cast<std::size_t>(size));
            stream.seek(0);
            sf::Int64 read = stream.read(&buffer[0], size);
            success = (read == size);
        }
        buffer.push_back('\0');
        return success;
    }